

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

TValue * lj_tab_set(lua_State *L,GCtab *t,cTValue *key)

{
  double dVar1;
  uint key_00;
  int iVar2;
  TValue *local_48;
  int32_t k;
  lua_Number nk;
  Node *n;
  cTValue *key_local;
  GCtab *t_local;
  lua_State *L_local;
  
  t->nomm = '\0';
  if ((int)(key->field_4).it >> 0xf == -5) {
    L_local = (lua_State *)lj_tab_setstr(L,t,(GCstr *)(key->u64 & 0x7fffffffffff));
  }
  else {
    if ((uint)((int)(key->field_4).it >> 0xf) < 0xfffffff2) {
      dVar1 = key->n;
      key_00 = (uint)dVar1;
      if ((dVar1 == (double)(int)key_00) && (!NAN(dVar1) && !NAN((double)(int)key_00))) {
        if (key_00 < t->asize) {
          local_48 = (TValue *)((t->array).ptr64 + (long)(int)key_00 * 8);
        }
        else {
          local_48 = lj_tab_setinth(L,t,key_00);
        }
        return local_48;
      }
      if ((key->n != key->n) || (NAN(key->n) || NAN(key->n))) {
        lj_err_msg(L,LJ_ERR_NANIDX);
      }
    }
    else if (key->u64 == 0xffffffffffffffff) {
      lj_err_msg(L,LJ_ERR_NILIDX);
    }
    nk = (lua_Number)hashkey(t,key);
    do {
      iVar2 = lj_obj_equal((cTValue *)((long)nk + 8),key);
      if (iVar2 != 0) {
        return (TValue *)nk;
      }
      nk = *(lua_Number *)((long)nk + 0x10);
    } while (nk != 0.0);
    L_local = (lua_State *)lj_tab_newkey(L,t,key);
  }
  return (TValue *)L_local;
}

Assistant:

TValue *lj_tab_set(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n;
  t->nomm = 0;  /* Invalidate negative metamethod cache. */
  if (tvisstr(key)) {
    return lj_tab_setstr(L, t, strV(key));
  } else if (tvisint(key)) {
    return lj_tab_setint(L, t, intV(key));
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if (nk == (lua_Number)k)
      return lj_tab_setint(L, t, k);
    if (tvisnan(key))
      lj_err_msg(L, LJ_ERR_NANIDX);
    /* Else use the generic lookup. */
  } else if (tvisnil(key)) {
    lj_err_msg(L, LJ_ERR_NILIDX);
  }
  n = hashkey(t, key);
  do {
    if (lj_obj_equal(&n->key, key))
      return &n->val;
  } while ((n = nextnode(n)));
  return lj_tab_newkey(L, t, key);
}